

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O1

ostream * pstore::operator<<(ostream *stream,variant_type variant)

{
  size_t sVar1;
  char *__s;
  
  if (variant < 4) {
    __s = &DAT_0017263c + *(int *)(&DAT_0017263c + (ulong)variant * 4);
  }
  else {
    __s = "";
  }
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar1);
  return stream;
}

Assistant:

std::ostream & operator<< (std::ostream & stream, uuid::variant_type const variant) {
        char const * str = "";
        switch (variant) {
        case uuid::variant_type::ncs: str = "ncs"; break;
        case uuid::variant_type::rfc_4122: str = "rfc_4122"; break;
        case uuid::variant_type::microsoft: str = "microsoft"; break;
        case uuid::variant_type::future: str = "future"; break; // future definition
        }
        return stream << str;
    }